

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcBalance.c
# Opt level: O0

int Abc_NtkBalanceLevel_rec(Abc_Obj_t *pNode)

{
  Abc_Obj_t *p;
  int iVar1;
  Abc_Obj_t *pAVar2;
  uint local_30;
  int local_2c;
  int LevelMax;
  int i;
  Abc_Obj_t *pFanin;
  Vec_Ptr_t *vSuper;
  Abc_Obj_t *pNode_local;
  
  iVar1 = Abc_ObjIsComplement(pNode);
  if (iVar1 != 0) {
    __assert_fail("!Abc_ObjIsComplement(pNode)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcBalance.c"
                  ,0x22f,"int Abc_NtkBalanceLevel_rec(Abc_Obj_t *)");
  }
  if (*(uint *)&pNode->field_0x14 >> 0xc == 0) {
    iVar1 = Abc_ObjIsCi(pNode);
    if (iVar1 == 0) {
      p = (pNode->field_6).pCopy;
      if (p == (Abc_Obj_t *)0x0) {
        __assert_fail("vSuper != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcBalance.c"
                      ,0x235,"int Abc_NtkBalanceLevel_rec(Abc_Obj_t *)");
      }
      local_30 = 0;
      for (local_2c = 0; iVar1 = Vec_PtrSize((Vec_Ptr_t *)p), local_2c < iVar1;
          local_2c = local_2c + 1) {
        pAVar2 = (Abc_Obj_t *)Vec_PtrEntry((Vec_Ptr_t *)p,local_2c);
        pAVar2 = Abc_ObjRegular(pAVar2);
        Abc_NtkBalanceLevel_rec(pAVar2);
        if (local_30 < *(uint *)&pAVar2->field_0x14 >> 0xc) {
          local_30 = *(uint *)&pAVar2->field_0x14 >> 0xc;
        }
      }
      *(uint *)&pNode->field_0x14 = *(uint *)&pNode->field_0x14 & 0xfff | (local_30 + 1) * 0x1000;
      pNode_local._4_4_ = *(uint *)&pNode->field_0x14 >> 0xc;
    }
    else {
      pNode_local._4_4_ = 0;
    }
  }
  else {
    pNode_local._4_4_ = *(uint *)&pNode->field_0x14 >> 0xc;
  }
  return pNode_local._4_4_;
}

Assistant:

int Abc_NtkBalanceLevel_rec( Abc_Obj_t * pNode )
{
    Vec_Ptr_t * vSuper;
    Abc_Obj_t * pFanin;
    int i, LevelMax;
    assert( !Abc_ObjIsComplement(pNode) );
    if ( pNode->Level > 0 )
        return pNode->Level;
    if ( Abc_ObjIsCi(pNode) )
        return 0;
    vSuper = (Vec_Ptr_t *)pNode->pCopy;
    assert( vSuper != NULL );
    LevelMax = 0;
    Vec_PtrForEachEntry( Abc_Obj_t *, vSuper, pFanin, i )
    {
        pFanin = Abc_ObjRegular(pFanin);
        Abc_NtkBalanceLevel_rec(pFanin);
        if ( LevelMax < (int)pFanin->Level )
            LevelMax = pFanin->Level;
    }
    pNode->Level = LevelMax + 1;
    return pNode->Level;
}